

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall
pbrt::BilinearPatchMesh::BilinearPatchMesh
          (BilinearPatchMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *P,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *N,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *UV,
          vector<int,_std::allocator<int>_> *fIndices,PiecewiseConstant2D *imageDist)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  size_type sVar7;
  int *piVar8;
  iterator n_00;
  reference pPVar9;
  Point3<float> *pPVar10;
  Point2<float> *pPVar11;
  Normal3<float> *pNVar12;
  char (*args_1) [16];
  vector<int,_std::allocator<int>_> *in_RCX;
  byte in_DL;
  byte *in_RDI;
  Transform *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  long *in_FS_OFFSET;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  Point3<float> PVar13;
  Normal3<float> NVar14;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  undefined8 in_stack_00000018;
  Point3<float> *in_stack_00000028;
  Transform *in_stack_00000030;
  size_type vb_5;
  int va_5;
  Normal3f *n;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *__range2;
  size_type vb_4;
  int va_4;
  size_type vb_3;
  int va_3;
  Point3f *p;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  int vb_2;
  size_type va_2;
  int vb_1;
  size_type va_1;
  int vb;
  size_type va;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffffe78;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffffe80;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  char (*in_stack_fffffffffffffec8) [32];
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef4;
  float in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  reference in_stack_ffffffffffffff18;
  __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
  local_d8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  BufferCache<pbrt::Normal3<float>_> *in_stack_ffffffffffffff38;
  Transform *in_stack_ffffffffffffffc0;
  
  *in_RDI = in_DL & 1;
  bVar5 = Transform::SwapsHandedness(in_stack_ffffffffffffffc0);
  in_RDI[1] = bVar5;
  sVar7 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  *(int *)(in_RDI + 4) = (int)(sVar7 >> 2);
  sVar7 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                    ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_R8);
  *(int *)(in_RDI + 8) = (int)sVar7;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  *(undefined8 *)(in_RDI + 0x38) = in_stack_00000018;
  sVar7 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  if ((sVar7 & 3) != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              ((LogLevel)in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
               (char (*) [21])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char (*) [2])in_stack_fffffffffffffec8,
               (char (*) [21])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (char (*) [2])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int *)in_stack_ffffffffffffff18);
  }
  *(long *)(*in_FS_OFFSET + -0x4c0) = *(long *)(*in_FS_OFFSET + -0x4c0) + 1;
  *(long *)(*in_FS_OFFSET + -0x4b8) = (long)*(int *)(in_RDI + 4) + *(long *)(*in_FS_OFFSET + -0x4b8)
  ;
  sVar7 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                    ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)in_R8);
  iVar6 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar6 < sVar7) {
    LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
              ((LogLevel)in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
               (char (*) [9])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,
               (char (*) [9])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (char (*) [32])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int *)in_stack_ffffffffffffff18);
  }
  sVar7 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  iVar6 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar6 < sVar7) {
    LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
              ((LogLevel)in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
               (char (*) [15])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,
               (char (*) [15])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (char (*) [32])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int *)in_stack_ffffffffffffff18);
  }
  piVar8 = BufferCache<int>::LookupOrAdd
                     ((BufferCache<int> *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  *(int **)(in_RDI + 0x10) = piVar8;
  *(long *)(*in_FS_OFFSET + -0x4b0) = *(long *)(*in_FS_OFFSET + -0x4b0) + 0x40;
  n_00 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::begin
                   ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                    in_stack_fffffffffffffe78);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::end
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffe78);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar5) break;
    pPVar9 = __gnu_cxx::
             __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
             ::operator*((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                          *)&stack0xffffffffffffff88);
    PVar13 = Transform::operator()(in_stack_00000030,in_stack_00000028);
    auVar4._8_8_ = extraout_XMM0_Qb;
    auVar4._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    uVar1 = vmovlpd_avx(auVar4);
    (pPVar9->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar1;
    (pPVar9->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
    (pPVar9->super_Tuple3<pbrt::Point3,_float>).z = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
    __gnu_cxx::
    __normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
    ::operator++((__normal_iterator<pbrt::Point3<float>_*,_std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>_>
                  *)&stack0xffffffffffffff88);
  }
  pPVar10 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd
                      ((BufferCache<pbrt::Point3<float>_> *)in_stack_ffffffffffffff38,
                       (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_ffffffffffffff30);
  *(Point3<float> **)(in_RDI + 0x18) = pPVar10;
  bVar5 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                    ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                     in_stack_fffffffffffffe90);
  if (!bVar5) {
    iVar6 = *(int *)(in_RDI + 8);
    sVar7 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                      (in_stack_00000008);
    if ((long)iVar6 != sVar7) {
      LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                ((LogLevel)in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char (*) [10])in_stack_fffffffffffffec8,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (unsigned_long *)in_stack_ffffffffffffff18);
    }
    pPVar11 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                        ((BufferCache<pbrt::Point2<float>_> *)in_stack_ffffffffffffff38,
                         (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         in_stack_ffffffffffffff30);
    *(Point2<float> **)(in_RDI + 0x28) = pPVar11;
  }
  bVar5 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                    ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                     in_stack_fffffffffffffe90);
  if (!bVar5) {
    iVar6 = *(int *)(in_RDI + 8);
    in_stack_ffffffffffffff38 =
         (BufferCache<pbrt::Normal3<float>_> *)
         std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                   ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)in_R9);
    if ((BufferCache<pbrt::Normal3<float>_> *)(long)iVar6 != in_stack_ffffffffffffff38) {
      LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                ((LogLevel)in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                 (char (*) [10])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char (*) [9])in_stack_fffffffffffffec8,
                 (char (*) [10])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char (*) [9])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (unsigned_long *)in_stack_ffffffffffffff18);
    }
    local_d8._M_current =
         (Normal3<float> *)
         std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::begin
                   (in_stack_fffffffffffffe78);
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::end
              (in_stack_fffffffffffffe78);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        ((__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar5) break;
      in_stack_ffffffffffffff18 =
           __gnu_cxx::
           __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
           ::operator*(&local_d8);
      NVar14 = Transform::operator()(in_R8,(Normal3<float> *)n_00._M_current);
      in_stack_ffffffffffffff00 = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      uVar1 = vmovlpd_avx(auVar2);
      in_stack_ffffffffffffff0c = (undefined4)uVar1;
      in_stack_ffffffffffffff10 = (undefined4)((ulong)uVar1 >> 0x20);
      (in_stack_ffffffffffffff18->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar1;
      (in_stack_ffffffffffffff18->super_Tuple3<pbrt::Normal3,_float>).y =
           (float)(int)((ulong)uVar1 >> 0x20);
      (in_stack_ffffffffffffff18->super_Tuple3<pbrt::Normal3,_float>).z = in_stack_ffffffffffffff00;
      in_stack_ffffffffffffff14 = in_stack_ffffffffffffff00;
      if ((in_DL & 1) != 0) {
        NVar14 = Tuple3<pbrt::Normal3,_float>::operator-(in_stack_fffffffffffffe80);
        in_stack_fffffffffffffef4 = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar3._8_8_ = extraout_XMM0_Qb_01;
        auVar3._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        in_stack_fffffffffffffed8 = (char *)vmovlpd_avx(auVar3);
        in_stack_fffffffffffffeec = SUB84(in_stack_fffffffffffffed8,0);
        *(char **)&in_stack_ffffffffffffff18->super_Tuple3<pbrt::Normal3,_float> =
             in_stack_fffffffffffffed8;
        (in_stack_ffffffffffffff18->super_Tuple3<pbrt::Normal3,_float>).z =
             in_stack_fffffffffffffef4;
      }
      __gnu_cxx::
      __normal_iterator<pbrt::Normal3<float>_*,_std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>_>
      ::operator++(&local_d8);
    }
    pNVar12 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd
                        (in_stack_ffffffffffffff38,
                         (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         in_R9);
    *(Normal3<float> **)(in_RDI + 0x20) = pNVar12;
    in_stack_ffffffffffffff30 = in_R9;
  }
  bVar5 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffe90);
  if (!bVar5) {
    iVar6 = *(int *)(in_RDI + 4);
    args_1 = (char (*) [16])std::vector<int,_std::allocator<int>_>::size(in_stack_00000010);
    if ((char (*) [16])(long)iVar6 != args_1) {
      LogFatal<char_const(&)[9],char_const(&)[16],char_const(&)[9],int&,char_const(&)[16],unsigned_long&>
                ((LogLevel)in_stack_fffffffffffffef4,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                 (char (*) [9])CONCAT44(iVar6,in_stack_fffffffffffffed0),args_1,
                 (char (*) [9])CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char (*) [16])CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (unsigned_long *)in_stack_ffffffffffffff18);
    }
    piVar8 = BufferCache<int>::LookupOrAdd
                       ((BufferCache<int> *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    *(int **)(in_RDI + 0x30) = piVar8;
  }
  return;
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(std::move(imageDist)) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to world space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices);
    }
}